

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::findNextLeaf(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
               *this)

{
  BacktrackData elem;
  anon_class_16_2_fd512ddb f;
  bool bVar1;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_RDI;
  bool in_stack_00000017;
  Node *in_stack_00000018;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_00000020;
  Node *n;
  anon_class_8_1_8991fb9c leaveLeaf;
  Stack<Lib::BacktrackData> *this_00;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar2;
  BacktrackData in_stack_ffffffffffffffb0;
  BacktrackData in_stack_ffffffffffffffd0;
  bool local_1;
  
  bVar1 = Lib::
          Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
          ::isEmpty(&in_RDI->_nodeIterators);
  if (bVar1) {
    local_1 = false;
  }
  else {
    bVar1 = Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>
            ::isSome(&(in_RDI->_leafData).
                      super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>
                    );
    if (bVar1) {
      findNextLeaf::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffffd0._boList);
    }
    do {
      while( true ) {
        Lib::
        Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
        ::top(&in_RDI->_nodeIterators);
        bVar1 = Lib::
                VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                ::hasNext((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                           *)0x43d9e9);
        bVar2 = 0;
        if (!bVar1) {
          bVar1 = Lib::Stack<Lib::BacktrackData>::isEmpty(&in_RDI->_bdStack);
          bVar2 = bVar1 ^ 0xff;
        }
        if ((bVar2 & 1) == 0) break;
        Lib::Stack<Lib::BacktrackData>::pop(&in_RDI->_bdStack);
        Lib::BacktrackData::backtrack((BacktrackData *)in_stack_ffffffffffffffb0._boList);
      }
      Lib::
      Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
      ::top(&in_RDI->_nodeIterators);
      bVar1 = Lib::
              VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              ::hasNext((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                         *)0x43da49);
      if (!bVar1) {
        return false;
      }
      Lib::
      Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
      ::top(&in_RDI->_nodeIterators);
      Lib::
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
      ::next((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)0x43da6d);
      this_00 = &in_RDI->_bdStack;
      Lib::BacktrackData::BacktrackData((BacktrackData *)&stack0xffffffffffffffd0);
      elem._boList._7_1_ = bVar2;
      elem._boList._0_7_ = in_stack_ffffffffffffffa0;
      Lib::Stack<Lib::BacktrackData>::push(this_00,elem);
      f.n = (Node **)in_stack_ffffffffffffffb0._boList;
      f.this = in_RDI;
      bVar1 = Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
              ::
              runRecording<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::findNextLeaf()::_lambda()_2_>
                        ((Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
                          *)CONCAT17(bVar2,in_stack_ffffffffffffffa0),f);
      if (bVar1) {
        prepareChildren(in_stack_00000020,in_stack_00000018,in_stack_00000017);
        bVar1 = Lib::
                OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::
                isSome(&(in_RDI->_leafData).
                        super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>
                      );
        if ((bVar1) &&
           (bVar1 = Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
                    ::
                    runRecording<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier*,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::findNextLeaf()::_lambda()_3_>
                              (in_RDI,(anon_class_8_1_8991fb9c)in_stack_ffffffffffffffb0._boList),
           !bVar1)) {
          findNextLeaf::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffffd0._boList);
        }
      }
      else {
        in_stack_ffffffffffffffb0 = Lib::Stack<Lib::BacktrackData>::pop(&in_RDI->_bdStack);
        Lib::BacktrackData::backtrack((BacktrackData *)in_stack_ffffffffffffffb0._boList);
      }
      bVar1 = Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>::
              isNone((Option<Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>_>
                      *)0x43db43);
    } while (bVar1);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool findNextLeaf()
      {
        if(_nodeIterators.isEmpty()) {
          //There are no node iterators in the stack, so there's nowhere
          //to look for the next leaf.
          //This shouldn't hapen during the regular retrieval process, but it
          //can happen when there are no literals inserted for a predicate,
          //or when predicates with zero arity are encountered.
          ASS(_bdStack.isEmpty());
          return false;
        }

        auto leaveLeaf = [&]() {
            ASS(!_normalizationRecording);
            _bdStack.pop().backtrack();
            _leafData = {};
        };

        if(_leafData.isSome()) {
          leaveLeaf();
        }

        ASS(!_normalizationRecording);
        ASS(_bdStack.length()+1==_nodeIterators.length());

        do {
          while (!_nodeIterators.top().hasNext() && !_bdStack.isEmpty()) {
            _bdStack.pop().backtrack();
          }
          if(!_nodeIterators.top().hasNext()) {
            return false;
          }
          Node* n=*_nodeIterators.top().next();
          DEBUG_QUERY(1, "trying S", _svStack.top(), " -> ", n->term())

          _bdStack.push(BacktrackData());

          if (runRecording([&]() { return _algo.associate(_svStack.top(), n->term());})) {
            prepareChildren(n, /* backtrackable */ true);
            if (_leafData.isSome() && !runRecording([&](){ return _algo.doFinalLeafCheck(); })) {
              leaveLeaf();
              continue;
            }
          } else {
            _bdStack.pop().backtrack();
            continue;
          }
        } while(_leafData.isNone());
        ASS(_leafData.isSome())
        ASS(_bdStack.size() != 0)
        return true;
      }